

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O1

void __thiscall
glslang::TParseContext::mergeQualifiers
          (TParseContext *this,TSourceLoc *loc,TQualifier *dst,TQualifier *src,bool force)

{
  pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_> *ppVar1;
  pair<const_int,_glslang::TVector<const_glslang::TIntermTyped_*>_> *__v;
  _Rb_tree_header *p_Var2;
  undefined8 uVar3;
  TSpirvDecorate *pTVar4;
  TSpirvDecorate *this_00;
  _func_int *UNRECOVERED_JUMPTABLE;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  _Base_ptr p_Var12;
  _Base_ptr p_Var13;
  uint uVar14;
  uint uVar15;
  _Base_ptr p_Var16;
  _Rb_tree_header *p_Var17;
  char *pcVar18;
  ulong uVar19;
  uint uVar20;
  TMap<int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>,_std::less<int>_> *__range3;
  _Rb_tree_header *p_Var21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  byte bVar27;
  ushort uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  TParseContext *this_01;
  uint uVar33;
  uint uVar34;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  uint uVar38;
  uint uVar39;
  TSpirvDecorate *dstSpirvDecorate;
  
  this_01 = this;
  if (((*(uint *)&src->field_0xa & 0x31802000) != 0) &&
     ((*(ulong *)&dst->field_0x8 & 0x318020000000) != 0)) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"can only have one auxiliary qualifier (centroid, patch, and sample)","","")
    ;
  }
  if (((*(ushort *)&src->field_0xb & 0x60c0) != 0) &&
     ((*(ulong *)&dst->field_0x8 & 0x60c0000000) != 0)) {
    this_01 = this;
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,
               "can only have one interpolation qualifier (flat, smooth, noperspective, __explicitInterpAMD)"
               ,"","");
  }
  if (!force) {
    iVar10 = 0x1a4;
    if ((this->super_TParseContextBase).super_TParseVersions.profile == EEsProfile) {
      iVar10 = 0x136;
    }
    if (((this->super_TParseContextBase).super_TParseVersions.version < iVar10) &&
       (this_01 = this,
       iVar10 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[8])
                          (this,"GL_ARB_shading_language_420pack"), (char)iVar10 == '\0')) {
      if (((*(ulong *)&src->field_0x8 & 0x1000000000) != 0) &&
         ((*(ulong *)&dst->field_0x8 & 0x31e0fe00007f) != 0)) {
        this_01 = this;
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"precise qualifier must appear first","","");
      }
      uVar11 = *(ulong *)&src->field_0x8;
      if ((((uint)uVar11 >> 0x1c & 1) == 0) || ((*(ulong *)&dst->field_0x8 & 0x31e0ee00007f) == 0))
      {
        if (((uVar11 & 0x60c0000000) != 0) && ((*(ulong *)&dst->field_0x8 & 0x31802e00007f) != 0)) {
          pcVar18 = "interpolation qualifiers must appear before storage and precision qualifiers";
          goto LAB_0042ae2a;
        }
        if (((uVar11 & 0x318020000000) != 0) && ((*(uint *)&dst->field_0x8 & 0xe00007f) != 0)) {
          pcVar18 = 
          "Auxiliary qualifiers (centroid, patch, and sample) must appear before storage and precision qualifiers"
          ;
          goto LAB_0042ae2a;
        }
        if (((uVar11 & 0x7f) != 0) && ((dst->field_0xb & 0xe) != 0)) {
          pcVar18 = "precision qualifier must appear as last qualifier";
          goto LAB_0042ae2a;
        }
      }
      else {
        pcVar18 = 
        "invariant qualifier must appear before interpolation, storage, and precision qualifiers ";
LAB_0042ae2a:
        this_01 = this;
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,pcVar18,"","");
      }
      if ((((*(ulong *)&src->field_0x8 & 0x1000000000) != 0) &&
          ((*(uint *)&dst->field_0x8 & 0x7f) < 0x12)) &&
         ((0x30004U >> (*(uint *)&dst->field_0x8 & 0x1f) & 1) != 0)) {
        this_01 = this;
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"precise qualifier must appear first","","");
      }
      if (((*(uint *)&src->field_0x8 & 0x7f) == 2) && ((*(uint *)&dst->field_0x8 & 0x7e) == 0x10)) {
        this_01 = this;
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"in/out must appear before const","","");
      }
    }
  }
  uVar11 = *(ulong *)&dst->field_0x8;
  uVar14 = (uint)uVar11 & 0x7f;
  if (uVar14 < 2) {
    uVar11 = uVar11 & 0xffffffffffffff80 | (ulong)((uint)*(undefined8 *)&src->field_0x8 & 0x7f);
LAB_0042af59:
    *(ulong *)&dst->field_0x8 = uVar11;
  }
  else {
    if ((uVar14 == 0x10) && ((*(uint *)&src->field_0x8 & 0x7f) == 0x11)) {
LAB_0042af1e:
      uVar11 = uVar11 & 0xffffffffffffff80 | 0x12;
      goto LAB_0042af59;
    }
    uVar14 = (uint)uVar11 & 0x7f;
    if (uVar14 == 2) {
      if ((*(uint *)&src->field_0x8 & 0x7f) == 0x10) {
LAB_0042af51:
        uVar11 = uVar11 & 0xffffffffffffff80 | 0x13;
        goto LAB_0042af59;
      }
    }
    else if (uVar14 == 0x10) {
      if ((*(uint *)&src->field_0x8 & 0x7f) == 2) goto LAB_0042af51;
    }
    else if ((uVar14 == 0x11) && ((*(uint *)&src->field_0x8 & 0x7f) == 0x10)) goto LAB_0042af1e;
    uVar14 = (uint)*(undefined8 *)&src->field_0x8;
    uVar26 = uVar14 & 0x7f;
    if (1 < uVar26) {
      if (uVar26 < 0x1f) {
        pcVar18 = (&PTR_anon_var_dwarf_bac4b0_00942d88)[uVar14 & 0x7f];
      }
      else {
        pcVar18 = "unknown qualifier";
      }
      this_01 = this;
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"too many storage qualifiers",pcVar18,"");
    }
  }
  if (((!force) && (uVar14 = *(uint *)&src->field_0x8 >> 0x19 & 7, uVar14 != 0)) &&
     ((dst->field_0xb & 0xe) != 0)) {
    if (uVar14 < 4) {
      pcVar18 = *(char **)(&DAT_00942d20 + (ulong)uVar14 * 8);
    }
    else {
      pcVar18 = "unknown precision qualifier";
    }
    this_01 = this;
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"only one precision qualifier allowed",pcVar18,"");
  }
  if ((*(ulong *)&dst->field_0x8 & 0xe000000) == 0) {
LAB_0042b00e:
    *(ulong *)&dst->field_0x8 =
         *(ulong *)&dst->field_0x8 & 0xfffffffff1ffffff |
         (ulong)((uint)*(undefined8 *)&src->field_0x8 & 0xe000000);
LAB_0042b026:
    if (force) goto LAB_0042b106;
  }
  else if (force) {
    if ((src->field_0xb & 0xe) != 0) goto LAB_0042b00e;
    goto LAB_0042b026;
  }
  uVar11 = *(ulong *)&src->field_0x8;
  if (((((((uVar11 & 0x2000000000000) != 0) && ((*(ushort *)&dst->field_0xe & 0x1f0) != 0)) ||
        (((uVar11 & 0x10000000000000) != 0 && ((*(ushort *)&dst->field_0xe & 0x1e2) != 0)))) ||
       (((uVar11 & 0x20000000000000) != 0 && ((*(ushort *)&dst->field_0xe & 0x1d2) != 0)))) ||
      (((uVar11 & 0x40000000000000) != 0 && ((*(ushort *)&dst->field_0xe & 0x1b2) != 0)))) ||
     ((((uVar11 & 0x80000000000000) != 0 && ((*(ushort *)&dst->field_0xe & 0x172) != 0)) ||
      (((uVar11 & 0x100000000000000) != 0 && ((dst->field_0xe & 0xf2) != 0)))))) {
    uVar14 = (uint)(uVar11 >> 0x19) & 7;
    if (uVar14 < 4) {
      pcVar18 = *(char **)(&DAT_00942d20 + (ulong)uVar14 * 8);
    }
    else {
      pcVar18 = "unknown precision qualifier";
    }
    this_01 = this;
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,
               "only one coherent/devicecoherent/queuefamilycoherent/workgroupcoherent/subgroupcoherent/shadercallcoherent qualifier allowed"
               ,pcVar18,"");
  }
LAB_0042b106:
  uVar26 = 0;
  mergeObjectLayoutQualifiers(this_01,dst,src,false);
  uVar11 = *(ulong *)&dst->field_0x8;
  uVar22 = (uint)(*(ulong *)&src->field_0x8 >> 0x1c) & 1;
  uVar14 = (uint)uVar11;
  if ((uVar14 >> 0x1c & 1) == 0) {
    uVar22 = 0;
  }
  uVar19 = (uint)*(ulong *)&src->field_0x8 & 0x10000000 | uVar11;
  *(ulong *)&dst->field_0x8 = uVar19;
  uVar15 = (uint)(*(ulong *)&src->field_0x8 >> 0x1d) & 1;
  if ((uVar14 >> 0x1d & 1) == 0) {
    uVar15 = 0;
  }
  uVar19 = (uint)*(ulong *)&src->field_0x8 & 0x20000000 | uVar19;
  *(ulong *)&dst->field_0x8 = uVar19;
  uVar5 = (uint)(*(ulong *)&src->field_0x8 >> 0x1e) & 1;
  if ((uVar14 >> 0x1e & 1) == 0) {
    uVar5 = uVar26;
  }
  uVar19 = (uint)*(ulong *)&src->field_0x8 & 0x40000000 | uVar19;
  *(ulong *)&dst->field_0x8 = uVar19;
  uVar3 = *(undefined8 *)&src->field_0x8;
  uVar19 = (uint)uVar3 & 0x80000000 | uVar19;
  *(ulong *)&dst->field_0x8 = uVar19;
  uVar33 = (uint)(*(ulong *)&src->field_0x8 >> 0x20) & 1;
  if ((uVar11 >> 0x20 & 1) == 0) {
    uVar33 = 0;
  }
  uVar19 = *(ulong *)&src->field_0x8 & 0x100000000 | uVar19;
  *(ulong *)&dst->field_0x8 = uVar19;
  uVar6 = (uint)(*(ulong *)&src->field_0x8 >> 0x24) & 1;
  if ((uVar11 & 0x1000000000) == 0) {
    uVar6 = uVar26;
  }
  uVar19 = *(ulong *)&src->field_0x8 & 0x1000000000 | uVar19;
  *(ulong *)&dst->field_0x8 = uVar19;
  uVar29 = (uint)(*(ulong *)&src->field_0x8 >> 0x25) & 1;
  if ((uVar11 >> 0x25 & 1) == 0) {
    uVar29 = 0;
  }
  uVar19 = *(ulong *)&src->field_0x8 & 0x2000000000 | uVar19;
  *(ulong *)&dst->field_0x8 = uVar19;
  uVar23 = (uint)(*(ulong *)&src->field_0x8 >> 0x26) & 1;
  if ((uVar11 >> 0x26 & 1) == 0) {
    uVar23 = 0;
  }
  uVar19 = *(ulong *)&src->field_0x8 & 0x4000000000 | uVar19;
  *(ulong *)&dst->field_0x8 = uVar19;
  uVar34 = (uint)(*(ulong *)&src->field_0x8 >> 0x29) & 1;
  if ((uVar11 >> 0x29 & 1) == 0) {
    uVar34 = 0;
  }
  uVar19 = *(ulong *)&src->field_0x8 & 0x20000000000 | uVar19;
  *(ulong *)&dst->field_0x8 = uVar19;
  uVar30 = (uint)(*(ulong *)&src->field_0x8 >> 0x2a) & 1;
  if ((uVar11 >> 0x2a & 1) == 0) {
    uVar30 = 0;
  }
  uVar19 = *(ulong *)&src->field_0x8 & 0x40000000000 | uVar19;
  *(ulong *)&dst->field_0x8 = uVar19;
  uVar24 = (uint)(*(ulong *)&src->field_0x8 >> 0x2b) & 1;
  if ((uVar11 >> 0x2b & 1) == 0) {
    uVar24 = 0;
  }
  uVar19 = *(ulong *)&src->field_0x8 & 0x80000000000 | uVar19;
  *(ulong *)&dst->field_0x8 = uVar19;
  uVar7 = (uint)(*(ulong *)&src->field_0x8 >> 0x2c) & 1;
  if ((uVar11 >> 0x2c & 1) == 0) {
    uVar7 = uVar26;
  }
  uVar19 = *(ulong *)&src->field_0x8 & 0x100000000000 | uVar19;
  *(ulong *)&dst->field_0x8 = uVar19;
  uVar39 = (uint)(*(ulong *)&src->field_0x8 >> 0x2d) & 1;
  if ((uVar11 >> 0x2d & 1) == 0) {
    uVar39 = 0;
  }
  uVar19 = *(ulong *)&src->field_0x8 & 0x200000000000 | uVar19;
  *(ulong *)&dst->field_0x8 = uVar19;
  uVar35 = (uint)(*(ulong *)&src->field_0x8 >> 0x31) & 1;
  if ((uVar11 & 0x2000000000000) == 0) {
    uVar35 = 0;
  }
  uVar19 = *(ulong *)&src->field_0x8 & 0x2000000000000 | uVar19;
  *(ulong *)&dst->field_0x8 = uVar19;
  uVar31 = (uint)(*(ulong *)&src->field_0x8 >> 0x34) & 1;
  if ((uVar11 & 0x10000000000000) == 0) {
    uVar31 = 0;
  }
  uVar19 = *(ulong *)&src->field_0x8 & 0x10000000000000 | uVar19;
  *(ulong *)&dst->field_0x8 = uVar19;
  uVar8 = (uint)(*(ulong *)&src->field_0x8 >> 0x35) & 1;
  if ((uVar11 & 0x20000000000000) == 0) {
    uVar8 = uVar26;
  }
  uVar19 = *(ulong *)&src->field_0x8 & 0x20000000000000 | uVar19;
  *(ulong *)&dst->field_0x8 = uVar19;
  uVar32 = (uint)(*(ulong *)&src->field_0x8 >> 0x36) & 1;
  if ((uVar11 & 0x40000000000000) == 0) {
    uVar32 = 0;
  }
  uVar19 = *(ulong *)&src->field_0x8 & 0x40000000000000 | uVar19;
  *(ulong *)&dst->field_0x8 = uVar19;
  uVar36 = (uint)(*(ulong *)&src->field_0x8 >> 0x37) & 1;
  if ((uVar11 & 0x80000000000000) == 0) {
    uVar36 = 0;
  }
  uVar19 = *(ulong *)&src->field_0x8 & 0x80000000000000 | uVar19;
  *(ulong *)&dst->field_0x8 = uVar19;
  bVar27 = (byte)(*(ulong *)&src->field_0x8 >> 0x38) & 1;
  if ((uVar11 & 0x100000000000000) == 0) {
    bVar27 = 0;
  }
  uVar19 = *(ulong *)&src->field_0x8 & 0x100000000000000 | uVar19;
  *(ulong *)&dst->field_0x8 = uVar19;
  uVar37 = (uint)(*(ulong *)&src->field_0x8 >> 0x39) & 1;
  if ((uVar11 >> 0x39 & 1) == 0) {
    uVar37 = 0;
  }
  uVar19 = *(ulong *)&src->field_0x8 & 0x200000000000000 | uVar19;
  *(ulong *)&dst->field_0x8 = uVar19;
  uVar25 = (uint)(*(ulong *)&src->field_0x8 >> 0x32) & 1;
  if ((uVar11 >> 0x32 & 1) == 0) {
    uVar25 = 0;
  }
  uVar19 = *(ulong *)&src->field_0x8 & 0x4000000000000 | uVar19;
  *(ulong *)&dst->field_0x8 = uVar19;
  uVar9 = (uint)(*(ulong *)&src->field_0x8 >> 0x33) & 1;
  if ((uVar11 >> 0x33 & 1) == 0) {
    uVar9 = uVar26;
  }
  uVar19 = *(ulong *)&src->field_0x8 & 0x8000000000000 | uVar19;
  *(ulong *)&dst->field_0x8 = uVar19;
  uVar26 = (uint)(*(ulong *)&src->field_0x8 >> 0x2e) & 1;
  if ((uVar11 >> 0x2e & 1) == 0) {
    uVar26 = 0;
  }
  uVar19 = *(ulong *)&src->field_0x8 & 0x400000000000 | uVar19;
  *(ulong *)&dst->field_0x8 = uVar19;
  uVar38 = (uint)(*(ulong *)&src->field_0x8 >> 0x2f) & 1;
  if ((uVar11 >> 0x2f & 1) == 0) {
    uVar38 = 0;
  }
  uVar19 = *(ulong *)&src->field_0x8 & 0x800000000000 | uVar19;
  *(ulong *)&dst->field_0x8 = uVar19;
  uVar28 = (ushort)(*(ulong *)&src->field_0x8 >> 0x30) & 1;
  if ((uVar11 >> 0x30 & 1) == 0) {
    uVar28 = 0;
  }
  uVar19 = *(ulong *)&src->field_0x8 & 0x1000000000000 | uVar19;
  *(ulong *)&dst->field_0x8 = uVar19;
  uVar20 = (uint)(*(ulong *)&src->field_0x8 >> 0x21) & 1;
  if ((uVar11 >> 0x21 & 1) == 0) {
    uVar20 = 0;
  }
  *(ulong *)&dst->field_0x8 = *(ulong *)&src->field_0x8 & 0x200000000 | uVar19;
  dst->spirvStorageClass = src->spirvStorageClass;
  pTVar4 = src->spirvDecorate;
  if (pTVar4 != (TSpirvDecorate *)0x0) {
    this_00 = dst->spirvDecorate;
    if (this_00 == (TSpirvDecorate *)0x0) {
      dst->spirvDecorate = pTVar4;
    }
    else {
      p_Var12 = (pTVar4->decorates).
                super_map<int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>_>_>
                ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var21 = &(pTVar4->decorates).
                 super_map<int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>_>_>
                 ._M_t._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)p_Var12 != p_Var21) {
        p_Var2 = &(this_00->decorates).
                  super_map<int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>_>_>
                  ._M_t._M_impl.super__Rb_tree_header;
        do {
          ppVar1 = (pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_> *)
                   (p_Var12 + 1);
          p_Var16 = (this_00->decorates).
                    super_map<int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>_>_>
                    ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var13 = &p_Var2->_M_header;
          if (p_Var16 != (_Base_ptr)0x0) {
            do {
              if (ppVar1->first <= (int)*(size_t *)(p_Var16 + 1)) {
                p_Var13 = p_Var16;
              }
              p_Var16 = (&p_Var16->_M_left)[(int)*(size_t *)(p_Var16 + 1) < ppVar1->first];
            } while (p_Var16 != (_Base_ptr)0x0);
          }
          p_Var17 = p_Var2;
          if (((_Rb_tree_header *)p_Var13 != p_Var2) &&
             (p_Var17 = (_Rb_tree_header *)p_Var13,
             ppVar1->first < (int)((_Rb_tree_header *)p_Var13)->_M_node_count)) {
            p_Var17 = p_Var2;
          }
          if (p_Var17 == p_Var2) {
            std::
            _Rb_tree<int,std::pair<int_const,glslang::TVector<glslang::TIntermConstantUnion_const*>>,std::_Select1st<std::pair<int_const,glslang::TVector<glslang::TIntermConstantUnion_const*>>>,std::less<int>,glslang::pool_allocator<std::pair<int_const,glslang::TVector<glslang::TIntermConstantUnion_const*>>>>
            ::
            _M_insert_unique<std::pair<int_const,glslang::TVector<glslang::TIntermConstantUnion_const*>>const&>
                      ((_Rb_tree<int,std::pair<int_const,glslang::TVector<glslang::TIntermConstantUnion_const*>>,std::_Select1st<std::pair<int_const,glslang::TVector<glslang::TIntermConstantUnion_const*>>>,std::less<int>,glslang::pool_allocator<std::pair<int_const,glslang::TVector<glslang::TIntermConstantUnion_const*>>>>
                        *)this_00,ppVar1);
          }
          else {
            (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                      (this,loc,"too many SPIR-V decorate qualifiers","spirv_decorate",
                       "(decoration=%u)",(ulong)(uint)ppVar1->first);
          }
          p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12);
        } while ((_Rb_tree_header *)p_Var12 != p_Var21);
      }
      p_Var12 = (pTVar4->decorateIds).
                super_map<int,_glslang::TVector<const_glslang::TIntermTyped_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermTyped_*>_>_>_>
                ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var21 = &(pTVar4->decorateIds).
                 super_map<int,_glslang::TVector<const_glslang::TIntermTyped_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermTyped_*>_>_>_>
                 ._M_t._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)p_Var12 != p_Var21) {
        p_Var2 = &(this_00->decorateIds).
                  super_map<int,_glslang::TVector<const_glslang::TIntermTyped_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermTyped_*>_>_>_>
                  ._M_t._M_impl.super__Rb_tree_header;
        do {
          __v = (pair<const_int,_glslang::TVector<const_glslang::TIntermTyped_*>_> *)(p_Var12 + 1);
          p_Var16 = (this_00->decorateIds).
                    super_map<int,_glslang::TVector<const_glslang::TIntermTyped_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermTyped_*>_>_>_>
                    ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var13 = &p_Var2->_M_header;
          if (p_Var16 != (_Base_ptr)0x0) {
            do {
              if (__v->first <= (int)*(size_t *)(p_Var16 + 1)) {
                p_Var13 = p_Var16;
              }
              p_Var16 = (&p_Var16->_M_left)[(int)*(size_t *)(p_Var16 + 1) < __v->first];
            } while (p_Var16 != (_Base_ptr)0x0);
          }
          p_Var17 = p_Var2;
          if (((_Rb_tree_header *)p_Var13 != p_Var2) &&
             (p_Var17 = (_Rb_tree_header *)p_Var13,
             __v->first < (int)((_Rb_tree_header *)p_Var13)->_M_node_count)) {
            p_Var17 = p_Var2;
          }
          if (p_Var17 == p_Var2) {
            std::
            _Rb_tree<int,std::pair<int_const,glslang::TVector<glslang::TIntermTyped_const*>>,std::_Select1st<std::pair<int_const,glslang::TVector<glslang::TIntermTyped_const*>>>,std::less<int>,glslang::pool_allocator<std::pair<int_const,glslang::TVector<glslang::TIntermTyped_const*>>>>
            ::
            _M_insert_unique<std::pair<int_const,glslang::TVector<glslang::TIntermTyped_const*>>const&>
                      ((_Rb_tree<int,std::pair<int_const,glslang::TVector<glslang::TIntermTyped_const*>>,std::_Select1st<std::pair<int_const,glslang::TVector<glslang::TIntermTyped_const*>>>,std::less<int>,glslang::pool_allocator<std::pair<int_const,glslang::TVector<glslang::TIntermTyped_const*>>>>
                        *)&this_00->decorateIds,__v);
          }
          else {
            (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                      (this,loc,"too many SPIR-V decorate qualifiers","spirv_decorate_id",
                       "(decoration=%u)",(ulong)(uint)__v->first);
          }
          p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12);
        } while ((_Rb_tree_header *)p_Var12 != p_Var21);
      }
      p_Var12 = (pTVar4->decorateStrings).
                super_map<int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>_>_>
                ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var21 = &(pTVar4->decorateStrings).
                 super_map<int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>_>_>
                 ._M_t._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)p_Var12 != p_Var21) {
        p_Var2 = &(this_00->decorates).
                  super_map<int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>_>_>
                  ._M_t._M_impl.super__Rb_tree_header;
        do {
          ppVar1 = (pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_> *)
                   (p_Var12 + 1);
          p_Var16 = (this_00->decorates).
                    super_map<int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>_>_>
                    ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var13 = &p_Var2->_M_header;
          if (p_Var16 != (_Base_ptr)0x0) {
            do {
              if (ppVar1->first <= (int)*(size_t *)(p_Var16 + 1)) {
                p_Var13 = p_Var16;
              }
              p_Var16 = (&p_Var16->_M_left)[(int)*(size_t *)(p_Var16 + 1) < ppVar1->first];
            } while (p_Var16 != (_Base_ptr)0x0);
          }
          p_Var17 = p_Var2;
          if (((_Rb_tree_header *)p_Var13 != p_Var2) &&
             (p_Var17 = (_Rb_tree_header *)p_Var13,
             ppVar1->first < (int)((_Rb_tree_header *)p_Var13)->_M_node_count)) {
            p_Var17 = p_Var2;
          }
          if (p_Var17 == p_Var2) {
            std::
            _Rb_tree<int,std::pair<int_const,glslang::TVector<glslang::TIntermConstantUnion_const*>>,std::_Select1st<std::pair<int_const,glslang::TVector<glslang::TIntermConstantUnion_const*>>>,std::less<int>,glslang::pool_allocator<std::pair<int_const,glslang::TVector<glslang::TIntermConstantUnion_const*>>>>
            ::
            _M_insert_unique<std::pair<int_const,glslang::TVector<glslang::TIntermConstantUnion_const*>>const&>
                      ((_Rb_tree<int,std::pair<int_const,glslang::TVector<glslang::TIntermConstantUnion_const*>>,std::_Select1st<std::pair<int_const,glslang::TVector<glslang::TIntermConstantUnion_const*>>>,std::less<int>,glslang::pool_allocator<std::pair<int_const,glslang::TVector<glslang::TIntermConstantUnion_const*>>>>
                        *)&this_00->decorateStrings,ppVar1);
          }
          else {
            (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                      (this,loc,"too many SPIR-V decorate qualifiers","spirv_decorate_string",
                       "(decoration=%u)",(ulong)(uint)ppVar1->first);
          }
          p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12);
        } while ((_Rb_tree_header *)p_Var12 != p_Var21);
      }
    }
  }
  if ((uVar20 == 0 && (uVar28 == 0 && (uVar38 == 0 && (uVar26 == 0 && uVar9 == 0)))) &&
      (uVar25 == 0 &&
      ((uVar37 == 0 && (bVar27 == 0 && (uVar36 == 0 && uVar32 == 0))) &&
      (uVar8 == 0 &&
      ((uVar31 == 0 && (uVar35 == 0 && (uVar39 == 0 && uVar7 == 0))) &&
      (uVar24 == 0 &&
      ((uVar30 == 0 && (uVar34 == 0 && (uVar23 == 0 && uVar29 == 0))) &&
      (uVar6 == 0 &&
      (uVar33 == 0 &&
      ((((byte)((ulong)uVar3 >> 0x18) >> 7 & (int)uVar14 < 0) == 0 && uVar5 == 0) &&
      (uVar15 == 0 && uVar22 == 0))))))))))) {
    return;
  }
  UNRECOVERED_JUMPTABLE =
       (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
  (*UNRECOVERED_JUMPTABLE)(this,loc,"replicated qualifiers","","",UNRECOVERED_JUMPTABLE);
  return;
}

Assistant:

void TParseContext::mergeQualifiers(const TSourceLoc& loc, TQualifier& dst, const TQualifier& src, bool force)
{
    // Multiple auxiliary qualifiers (mostly done later by 'individual qualifiers')
    if (src.isAuxiliary() && dst.isAuxiliary())
        error(loc, "can only have one auxiliary qualifier (centroid, patch, and sample)", "", "");

    // Multiple interpolation qualifiers (mostly done later by 'individual qualifiers')
    if (src.isInterpolation() && dst.isInterpolation())
        error(loc, "can only have one interpolation qualifier (flat, smooth, noperspective, __explicitInterpAMD)", "", "");

    // Ordering
    if (! force && ((!isEsProfile() && version < 420) ||
                    (isEsProfile() && version < 310))
                && ! extensionTurnedOn(E_GL_ARB_shading_language_420pack)) {
        // non-function parameters
        if (src.isNoContraction() && (dst.invariant || dst.isInterpolation() || dst.isAuxiliary() || dst.storage != EvqTemporary || dst.precision != EpqNone))
            error(loc, "precise qualifier must appear first", "", "");
        if (src.invariant && (dst.isInterpolation() || dst.isAuxiliary() || dst.storage != EvqTemporary || dst.precision != EpqNone))
            error(loc, "invariant qualifier must appear before interpolation, storage, and precision qualifiers ", "", "");
        else if (src.isInterpolation() && (dst.isAuxiliary() || dst.storage != EvqTemporary || dst.precision != EpqNone))
            error(loc, "interpolation qualifiers must appear before storage and precision qualifiers", "", "");
        else if (src.isAuxiliary() && (dst.storage != EvqTemporary || dst.precision != EpqNone))
            error(loc, "Auxiliary qualifiers (centroid, patch, and sample) must appear before storage and precision qualifiers", "", "");
        else if (src.storage != EvqTemporary && (dst.precision != EpqNone))
            error(loc, "precision qualifier must appear as last qualifier", "", "");

        // function parameters
        if (src.isNoContraction() && (dst.storage == EvqConst || dst.storage == EvqIn || dst.storage == EvqOut))
            error(loc, "precise qualifier must appear first", "", "");
        if (src.storage == EvqConst && (dst.storage == EvqIn || dst.storage == EvqOut))
            error(loc, "in/out must appear before const", "", "");
    }

    // Storage qualification
    if (dst.storage == EvqTemporary || dst.storage == EvqGlobal)
        dst.storage = src.storage;
    else if ((dst.storage == EvqIn  && src.storage == EvqOut) ||
             (dst.storage == EvqOut && src.storage == EvqIn))
        dst.storage = EvqInOut;
    else if ((dst.storage == EvqIn    && src.storage == EvqConst) ||
             (dst.storage == EvqConst && src.storage == EvqIn))
        dst.storage = EvqConstReadOnly;
    else if (src.storage != EvqTemporary &&
             src.storage != EvqGlobal)
        error(loc, "too many storage qualifiers", GetStorageQualifierString(src.storage), "");

    // Precision qualifiers
    if (! force && src.precision != EpqNone && dst.precision != EpqNone)
        error(loc, "only one precision qualifier allowed", GetPrecisionQualifierString(src.precision), "");
    if (dst.precision == EpqNone || (force && src.precision != EpqNone))
        dst.precision = src.precision;

    if (!force && ((src.coherent && (dst.devicecoherent || dst.queuefamilycoherent || dst.workgroupcoherent || dst.subgroupcoherent || dst.shadercallcoherent)) ||
                   (src.devicecoherent && (dst.coherent || dst.queuefamilycoherent || dst.workgroupcoherent || dst.subgroupcoherent || dst.shadercallcoherent)) ||
                   (src.queuefamilycoherent && (dst.coherent || dst.devicecoherent || dst.workgroupcoherent || dst.subgroupcoherent || dst.shadercallcoherent)) ||
                   (src.workgroupcoherent && (dst.coherent || dst.devicecoherent || dst.queuefamilycoherent || dst.subgroupcoherent || dst.shadercallcoherent)) ||
                   (src.subgroupcoherent  && (dst.coherent || dst.devicecoherent || dst.queuefamilycoherent || dst.workgroupcoherent || dst.shadercallcoherent)) ||
                   (src.shadercallcoherent && (dst.coherent || dst.devicecoherent || dst.queuefamilycoherent || dst.workgroupcoherent || dst.subgroupcoherent)))) {
        error(loc, "only one coherent/devicecoherent/queuefamilycoherent/workgroupcoherent/subgroupcoherent/shadercallcoherent qualifier allowed",
            GetPrecisionQualifierString(src.precision), "");
    }

    // Layout qualifiers
    mergeObjectLayoutQualifiers(dst, src, false);

    // individual qualifiers
    bool repeated = false;
    #define MERGE_SINGLETON(field) repeated |= dst.field && src.field; dst.field |= src.field;
    MERGE_SINGLETON(invariant);
    MERGE_SINGLETON(centroid);
    MERGE_SINGLETON(smooth);
    MERGE_SINGLETON(flat);
    MERGE_SINGLETON(specConstant);
    MERGE_SINGLETON(noContraction);
    MERGE_SINGLETON(nopersp);
    MERGE_SINGLETON(explicitInterp);
    MERGE_SINGLETON(perPrimitiveNV);
    MERGE_SINGLETON(perViewNV);
    MERGE_SINGLETON(perTaskNV);
    MERGE_SINGLETON(patch);
    MERGE_SINGLETON(sample);
    MERGE_SINGLETON(coherent);
    MERGE_SINGLETON(devicecoherent);
    MERGE_SINGLETON(queuefamilycoherent);
    MERGE_SINGLETON(workgroupcoherent);
    MERGE_SINGLETON(subgroupcoherent);
    MERGE_SINGLETON(shadercallcoherent);
    MERGE_SINGLETON(nonprivate);
    MERGE_SINGLETON(volatil);
    MERGE_SINGLETON(nontemporal);
    MERGE_SINGLETON(restrict);
    MERGE_SINGLETON(readonly);
    MERGE_SINGLETON(writeonly);
    MERGE_SINGLETON(nonUniform);

    // SPIR-V storage class qualifier (GL_EXT_spirv_intrinsics)
    dst.spirvStorageClass = src.spirvStorageClass;

    // SPIR-V decorate qualifiers (GL_EXT_spirv_intrinsics)
    if (src.hasSpirvDecorate()) {
        if (dst.hasSpirvDecorate()) {
            const TSpirvDecorate& srcSpirvDecorate = src.getSpirvDecorate();
            TSpirvDecorate& dstSpirvDecorate = dst.getSpirvDecorate();
            for (auto& decorate : srcSpirvDecorate.decorates) {
                if (dstSpirvDecorate.decorates.find(decorate.first) != dstSpirvDecorate.decorates.end())
                    error(loc, "too many SPIR-V decorate qualifiers", "spirv_decorate", "(decoration=%u)", decorate.first);
                else
                    dstSpirvDecorate.decorates.insert(decorate);
            }

            for (auto& decorateId : srcSpirvDecorate.decorateIds) {
                if (dstSpirvDecorate.decorateIds.find(decorateId.first) != dstSpirvDecorate.decorateIds.end())
                    error(loc, "too many SPIR-V decorate qualifiers", "spirv_decorate_id", "(decoration=%u)", decorateId.first);
                else
                    dstSpirvDecorate.decorateIds.insert(decorateId);
            }

            for (auto& decorateString : srcSpirvDecorate.decorateStrings) {
                if (dstSpirvDecorate.decorates.find(decorateString.first) != dstSpirvDecorate.decorates.end())
                    error(loc, "too many SPIR-V decorate qualifiers", "spirv_decorate_string", "(decoration=%u)", decorateString.first);
                else
                    dstSpirvDecorate.decorateStrings.insert(decorateString);
            }
        } else {
            dst.spirvDecorate = src.spirvDecorate;
        }
    }

    if (repeated)
        error(loc, "replicated qualifiers", "", "");
}